

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder_unittest.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::PathBuilderKeyRolloverTest_TestMultipleRootMatchesOnlyOneWorks_Test::TestBody
          (PathBuilderKeyRolloverTest_TestMultipleRootMatchesOnlyOneWorks_Test *this)

{
  shared_ptr<const_bssl::ParsedCertificate> *lhs;
  shared_ptr<const_bssl::ParsedCertificate> *lhs_00;
  shared_ptr<const_bssl::ParsedCertificate> *lhs_01;
  CertPathBuilderResultPath *pCVar1;
  bool bVar2;
  string *psVar3;
  pointer *__ptr;
  char *pcVar4;
  AssertHelper local_2c8;
  AssertionResult gtest_ar_;
  AssertHelper local_2b0;
  VerifyError error;
  Result result;
  __shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> local_248;
  __shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> local_238;
  __shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> local_218;
  TrustStoreCollection trust_store_collection;
  CertIssuerSourceStatic sync_certs;
  TrustStoreInMemory trust_store2;
  TrustStoreInMemory trust_store1;
  CertPathBuilder path_builder;
  
  TrustStoreCollection::TrustStoreCollection(&trust_store_collection);
  TrustStoreInMemory::TrustStoreInMemory(&trust_store1);
  TrustStoreInMemory::TrustStoreInMemory(&trust_store2);
  TrustStoreCollection::AddTrustStore(&trust_store_collection,&trust_store1.super_TrustStore);
  TrustStoreCollection::AddTrustStore(&trust_store_collection,&trust_store2.super_TrustStore);
  ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_218,
             &(this->super_PathBuilderKeyRolloverTest).newroot_.
              super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>);
  TrustStoreInMemory::AddTrustAnchor
            (&trust_store1,(shared_ptr<const_bssl::ParsedCertificate> *)&local_218);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_218._M_refcount);
  lhs = &(this->super_PathBuilderKeyRolloverTest).oldroot_;
  ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_228,
             &lhs->super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>);
  TrustStoreInMemory::AddTrustAnchor
            (&trust_store2,(shared_ptr<const_bssl::ParsedCertificate> *)&local_228);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_228._M_refcount);
  CertIssuerSourceStatic::CertIssuerSourceStatic(&sync_certs);
  lhs_00 = &(this->super_PathBuilderKeyRolloverTest).oldintermediate_;
  ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_238,
             &lhs_00->super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>)
  ;
  CertIssuerSourceStatic::AddCert
            (&sync_certs,(shared_ptr<const_bssl::ParsedCertificate> *)&local_238);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_238._M_refcount);
  lhs_01 = &(this->super_PathBuilderKeyRolloverTest).target_;
  ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_248,
             &lhs_01->super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>)
  ;
  pcVar4 = (char *)0x0;
  CertPathBuilder::CertPathBuilder
            (&path_builder,(shared_ptr<const_bssl::ParsedCertificate> *)&local_248,
             &trust_store_collection.super_TrustStore,
             &(this->super_PathBuilderKeyRolloverTest).delegate_.super_CertPathBuilderDelegate,
             &(this->super_PathBuilderKeyRolloverTest).time_,ANY_EKU,
             (this->super_PathBuilderKeyRolloverTest).initial_explicit_policy_,
             &(this->super_PathBuilderKeyRolloverTest).user_initial_policy_set_,
             (this->super_PathBuilderKeyRolloverTest).initial_policy_mapping_inhibit_,
             (this->super_PathBuilderKeyRolloverTest).initial_any_policy_inhibit_);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_248._M_refcount);
  CertPathBuilder::AddCertIssuerSource(&path_builder,&sync_certs.super_CertIssuerSource);
  CertPathBuilder::Run(&result,&path_builder);
  bVar2 = CertPathBuilder::Result::HasValidPath(&result);
  gtest_ar_.success_ = bVar2;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_2c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&error,(internal *)&gtest_ar_,(AssertionResult *)"result.HasValidPath()",
               "false","true",pcVar4);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
               ,0x524,(char *)CONCAT71(error.offset_._1_7_,(char)error.offset_));
    testing::internal::AssertHelper::operator=(&local_2b0,(Message *)&local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
    ::std::__cxx11::string::~string((string *)&error);
    if ((long *)CONCAT44(local_2c8.data_._4_4_,(StatusCode)local_2c8.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_2c8.data_._4_4_,(StatusCode)local_2c8.data_) + 8))();
    }
  }
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  local_2c8.data_._0_4_ = CERTIFICATE_INVALID_SIGNATURE;
  gtest_ar_._0_8_ =
       (long)result.paths.
             super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)result.paths.
             super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&error,"1U","result.paths.size()",(uint *)&local_2c8,
             (unsigned_long *)&gtest_ar_);
  if ((char)error.offset_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (error._8_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)error._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
               ,0x525,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2c8,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_2c8);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  else {
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&error.code_);
    bVar2 = CertPathBuilderResultPath::IsValid
                      (result.paths.
                       super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[result.best_result_index]._M_t.
                       super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                       .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>._M_head_impl
                      );
    gtest_ar_.success_ = bVar2;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (!bVar2) {
      testing::Message::Message((Message *)&local_2c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&error,(internal *)&gtest_ar_,
                 (AssertionResult *)"result.paths[result.best_result_index]->IsValid()","false",
                 "true",pcVar4);
      testing::internal::AssertHelper::AssertHelper
                (&local_2b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                 ,0x52a,(char *)CONCAT71(error.offset_._1_7_,(char)error.offset_));
      testing::internal::AssertHelper::operator=(&local_2b0,(Message *)&local_2c8);
      testing::internal::AssertHelper::~AssertHelper(&local_2b0);
      ::std::__cxx11::string::~string((string *)&error);
      if ((long *)CONCAT44(local_2c8.data_._4_4_,(StatusCode)local_2c8.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_2c8.data_._4_4_,(StatusCode)local_2c8.data_) + 8))();
      }
    }
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    pCVar1 = result.paths.
             super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[result.best_result_index]._M_t.
             super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
             ._M_t.
             super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
             .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>._M_head_impl;
    local_2c8.data_._0_4_ = CERTIFICATE_UNSUPPORTED_SIGNATURE_ALGORITHM;
    gtest_ar_._0_8_ =
         (long)*(pointer *)
                ((long)&(pCVar1->certs).
                        super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                + 8) -
         *(long *)&(pCVar1->certs).
                   super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
         >> 4;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&error,"3U","path.certs.size()",(uint *)&local_2c8,
               (unsigned_long *)&gtest_ar_);
    if ((char)error.offset_ != '\0') {
      ::std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&error.code_);
      testing::internal::
      CmpHelperEQ<std::shared_ptr<bssl::ParsedCertificate_const>,std::shared_ptr<bssl::ParsedCertificate_const>>
                ((internal *)&error,"target_","path.certs[0]",lhs_01,
                 *(shared_ptr<const_bssl::ParsedCertificate> **)
                  &(pCVar1->certs).
                   super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                );
      if ((char)error.offset_ == '\0') {
        testing::Message::Message((Message *)&gtest_ar_);
        if (error._8_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)error._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_2c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x52d,pcVar4);
        testing::internal::AssertHelper::operator=(&local_2c8,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_2c8);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
      ::std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&error.code_);
      testing::internal::
      CmpHelperEQ<std::shared_ptr<bssl::ParsedCertificate_const>,std::shared_ptr<bssl::ParsedCertificate_const>>
                ((internal *)&error,"oldintermediate_","path.certs[1]",lhs_00,
                 (shared_ptr<const_bssl::ParsedCertificate> *)
                 (*(long *)&(pCVar1->certs).
                            super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                 + 0x10));
      if ((char)error.offset_ == '\0') {
        testing::Message::Message((Message *)&gtest_ar_);
        if (error._8_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)error._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_2c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x52e,pcVar4);
        testing::internal::AssertHelper::operator=(&local_2c8,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_2c8);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
      ::std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&error.code_);
      testing::internal::
      CmpHelperEQ<std::shared_ptr<bssl::ParsedCertificate_const>,std::shared_ptr<bssl::ParsedCertificate_const>>
                ((internal *)&error,"oldroot_","path.certs[2]",lhs,
                 (shared_ptr<const_bssl::ParsedCertificate> *)
                 (*(long *)&(pCVar1->certs).
                            super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                 + 0x20));
      if ((char)error.offset_ == '\0') {
        testing::Message::Message((Message *)&gtest_ar_);
        if (error._8_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)error._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_2c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x52f,pcVar4);
        testing::internal::AssertHelper::operator=(&local_2c8,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_2c8);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
      ::std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&error.code_);
      CertPathBuilder::Result::GetBestPathVerifyError(&error,&result);
      local_2c8.data_._0_4_ = VerifyError::Code(&error);
      local_2b0.data_._0_4_ = 0;
      testing::internal::CmpHelperEQ<bssl::VerifyError::StatusCode,bssl::VerifyError::StatusCode>
                ((internal *)&gtest_ar_,"error.Code()","VerifyError::StatusCode::PATH_VERIFIED",
                 (StatusCode *)&local_2c8,(StatusCode *)&local_2b0);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&local_2c8);
        psVar3 = VerifyError::DiagnosticString_abi_cxx11_(&error);
        ::std::operator<<((ostream *)
                          (CONCAT44(local_2c8.data_._4_4_,(StatusCode)local_2c8.data_) + 0x10),
                          (string *)psVar3);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_2b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x532,pcVar4);
        testing::internal::AssertHelper::operator=(&local_2b0,(Message *)&local_2c8);
        testing::internal::AssertHelper::~AssertHelper(&local_2b0);
        if ((long *)CONCAT44(local_2c8.data_._4_4_,(StatusCode)local_2c8.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_2c8.data_._4_4_,(StatusCode)local_2c8.data_) + 8))();
        }
      }
      ::std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      ::std::__cxx11::string::~string((string *)&error.diagnostic_);
      goto LAB_002baa41;
    }
    testing::Message::Message((Message *)&gtest_ar_);
    if (error._8_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)error._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
               ,0x52c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2c8,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_2c8);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&error.code_);
LAB_002baa41:
  CertPathBuilder::Result::~Result(&result);
  CertPathBuilder::~CertPathBuilder(&path_builder);
  CertIssuerSourceStatic::~CertIssuerSourceStatic(&sync_certs);
  TrustStoreInMemory::~TrustStoreInMemory(&trust_store2);
  TrustStoreInMemory::~TrustStoreInMemory(&trust_store1);
  TrustStoreCollection::~TrustStoreCollection(&trust_store_collection);
  return;
}

Assistant:

TEST_F(PathBuilderKeyRolloverTest, TestMultipleRootMatchesOnlyOneWorks) {
  TrustStoreCollection trust_store_collection;
  TrustStoreInMemory trust_store1;
  TrustStoreInMemory trust_store2;
  trust_store_collection.AddTrustStore(&trust_store1);
  trust_store_collection.AddTrustStore(&trust_store2);
  // Add two trust anchors (newroot_ and oldroot_). Path building will attempt
  // them in this same order, as trust_store1 was added to
  // trust_store_collection first.
  trust_store1.AddTrustAnchor(newroot_);
  trust_store2.AddTrustAnchor(oldroot_);

  // Only oldintermediate is supplied, so the path with newroot should fail,
  // oldroot should succeed.
  CertIssuerSourceStatic sync_certs;
  sync_certs.AddCert(oldintermediate_);

  CertPathBuilder path_builder(
      target_, &trust_store_collection, &delegate_, time_, KeyPurpose::ANY_EKU,
      initial_explicit_policy_, user_initial_policy_set_,
      initial_policy_mapping_inhibit_, initial_any_policy_inhibit_);
  path_builder.AddCertIssuerSource(&sync_certs);

  auto result = path_builder.Run();

  EXPECT_TRUE(result.HasValidPath());
  ASSERT_EQ(1U, result.paths.size());

  // Due to authorityKeyIdentifier prioritization, path builder will first
  // attempt: target <- old intermediate <- oldroot
  // which should succeed.
  EXPECT_TRUE(result.paths[result.best_result_index]->IsValid());
  const auto &path = *result.paths[result.best_result_index];
  ASSERT_EQ(3U, path.certs.size());
  EXPECT_EQ(target_, path.certs[0]);
  EXPECT_EQ(oldintermediate_, path.certs[1]);
  EXPECT_EQ(oldroot_, path.certs[2]);

  VerifyError error = result.GetBestPathVerifyError();
  ASSERT_EQ(error.Code(), VerifyError::StatusCode::PATH_VERIFIED)
      << error.DiagnosticString();
}